

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::shiftCost(HEkkDual *this,HighsInt iCol,double amount)

{
  long lVar1;
  reference pvVar2;
  double *pdVar3;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double shift;
  double use_amount;
  HighsSimplexInfo *info;
  double local_30;
  double local_28;
  long local_20;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  local_20 = lVar1 + 0x2560;
  *(undefined1 *)(lVar1 + 0x28d4) = 1;
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    local_28 = in_XMM0_Qa;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x2590),(long)in_ESI);
    *pvVar2 = in_XMM0_Qa;
    local_30 = ABS(local_28);
    *(int *)(*(long *)(in_RDI + 0x40) + 0x8b0) = *(int *)(*(long *)(in_RDI + 0x40) + 0x8b0) + 1;
    *(int *)(*(long *)(in_RDI + 0x40) + 0x8b4) = *(int *)(*(long *)(in_RDI + 0x40) + 0x8b4) + 1;
    *(double *)(*(long *)(in_RDI + 0x40) + 0x8c0) =
         local_30 + *(double *)(*(long *)(in_RDI + 0x40) + 0x8c0);
    pdVar3 = std::max<double>(&local_30,(double *)(*(long *)(in_RDI + 0x40) + 0x8b8));
    *(double *)(*(long *)(in_RDI + 0x40) + 0x8b8) = *pdVar3;
  }
  return;
}

Assistant:

void HEkkDual::shiftCost(const HighsInt iCol, const double amount) {
  HighsSimplexInfo& info = ekk_instance_.info_;
  info.costs_shifted = true;
  assert(info.workShift_[iCol] == 0);
  if (!amount) return;
  double use_amount = amount;
  info.workShift_[iCol] = use_amount;
  // Analysis
  const double shift = fabs(use_amount);
  analysis->net_num_single_cost_shift++;
  analysis->num_single_cost_shift++;
  analysis->sum_single_cost_shift += shift;
  analysis->max_single_cost_shift = max(shift, analysis->max_single_cost_shift);
}